

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethernet.cpp
# Opt level: O0

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::Ethernet::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,Ethernet *this)

{
  bool bVar1;
  FUNCTION_RETURN FVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  size_type __n;
  undefined1 local_78 [8];
  HwIdentifier pc_id;
  array<unsigned_char,_7UL> *it;
  iterator __end3;
  iterator __begin3;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> *__range3
  ;
  undefined1 local_30 [4];
  FUNCTION_RETURN result;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  Ethernet *this_local;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *identifiers;
  
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
  vector((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> *
         )local_30);
  FVar2 = generate_ethernet_pc_id
                    ((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                      *)local_30,(bool)(this->use_ip & 1));
  std::
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  ::vector(__return_storage_ptr__);
  if (FVar2 == FUNC_RET_OK) {
    __n = std::
          vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
          size((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                *)local_30);
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::reserve(__return_storage_ptr__,__n);
    __end3 = std::
             vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
             ::begin((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                      *)local_30);
    it = (array<unsigned_char,_7UL> *)
         std::
         vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
         end((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
              *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::array<unsigned_char,_7UL>_*,_std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>_>
                                       *)&it), bVar1) {
      pc_id.m_data._M_elems =
           (_Type)__gnu_cxx::
                  __normal_iterator<std::array<unsigned_char,_7UL>_*,_std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>_>
                  ::operator*(&__end3);
      HwIdentifier::HwIdentifier((HwIdentifier *)local_78);
      strategy = (*(this->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])();
      HwIdentifier::set_identification_strategy((HwIdentifier *)local_78,strategy);
      HwIdentifier::set_data
                ((HwIdentifier *)local_78,(array<unsigned_char,_7UL> *)pc_id.m_data._M_elems);
      std::
      vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_78);
      HwIdentifier::~HwIdentifier((HwIdentifier *)local_78);
      __gnu_cxx::
      __normal_iterator<std::array<unsigned_char,_7UL>_*,_std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
  ~vector((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
           *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> Ethernet::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_ethernet_pc_id(data, use_ip);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}